

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O2

void filter_free_all(void)

{
  return;
}

Assistant:

void
filter_free_all(void)
{
#define FILTER_FREE(filt) do { \
    if (filt.libkqueue_free) \
        filt.libkqueue_free(); \
} while (0)

    FILTER_FREE(evfilt_read);
    FILTER_FREE(evfilt_write);
    FILTER_FREE(evfilt_signal);
    FILTER_FREE(evfilt_vnode);
    FILTER_FREE(evfilt_proc);
    FILTER_FREE(evfilt_timer);
    FILTER_FREE(evfilt_user);
    FILTER_FREE(evfilt_libkqueue);
}